

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_core.c
# Opt level: O3

void grasshopper_decrypt_block
               (grasshopper_round_keys_t *subkeys,grasshopper_w128_t *source,
               grasshopper_w128_t *target,grasshopper_w128_t *buffer)

{
  byte bVar1;
  bool bVar2;
  int i;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  uint64_t uVar7;
  ulong uVar8;
  
  target->q[0] = source->q[0];
  target->q[1] = source->q[1];
  buffer->q[0] = 0;
  buffer->q[1] = 0;
  lVar4 = 0x19f748;
  lVar5 = 0;
  uVar3 = 0;
  uVar6 = 0;
  do {
    bVar1 = target->b[lVar5];
    uVar3 = uVar3 ^ *(ulong *)(lVar4 + -8 + (ulong)bVar1 * 0x10);
    buffer->q[0] = uVar3;
    uVar6 = uVar6 ^ *(ulong *)(lVar4 + (ulong)bVar1 * 0x10);
    buffer->q[1] = uVar6;
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + 0x1000;
  } while (lVar5 != 0x10);
  target->q[0] = uVar3;
  uVar7 = buffer->q[1];
  target->q[1] = uVar7;
  uVar6 = 9;
  do {
    target->q[0] = uVar3 ^ subkeys->k[uVar6].q[0];
    target->q[1] = uVar7 ^ *(ulong *)((long)subkeys->k + uVar6 * 0x10 + 8);
    buffer->q[0] = 0;
    buffer->q[1] = 0;
    lVar5 = 0;
    uVar3 = 0;
    uVar8 = 0;
    lVar4 = 0x18f748;
    do {
      bVar1 = target->b[lVar5];
      uVar3 = uVar3 ^ *(ulong *)(lVar4 + -8 + (ulong)bVar1 * 0x10);
      buffer->q[0] = uVar3;
      uVar8 = uVar8 ^ *(ulong *)(lVar4 + (ulong)bVar1 * 0x10);
      buffer->q[1] = uVar8;
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x1000;
    } while (lVar5 != 0x10);
    target->q[0] = uVar3;
    uVar7 = buffer->q[1];
    target->q[1] = uVar7;
    bVar2 = 2 < uVar6;
    uVar6 = uVar6 - 1;
  } while (bVar2);
  target->q[0] = uVar3 ^ subkeys->k[1].q[0];
  target->q[1] = uVar7 ^ *(ulong *)((long)subkeys->k + 0x18);
  lVar4 = 0;
  do {
    target->b[lVar4] = grasshopper_pi_inv[target->b[lVar4]];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  target->q[0] = target->q[0] ^ subkeys->k[0].q[0];
  target->q[1] = target->q[1] ^ subkeys->k[0].q[1];
  return;
}

Assistant:

void grasshopper_decrypt_block(grasshopper_round_keys_t* subkeys, grasshopper_w128_t* source,
                               grasshopper_w128_t* target, grasshopper_w128_t* buffer) {
    int i;
    grasshopper_copy128(target, source);

    grasshopper_append128multi(buffer, target, grasshopper_l_dec128);

    for (i = 9; i > 1; i--) {
        grasshopper_append128(target, &subkeys->k[i]);
        grasshopper_append128multi(buffer, target, grasshopper_pil_dec128);
    }

    grasshopper_append128(target, &subkeys->k[1]);
    grasshopper_convert128(target, grasshopper_pi_inv);
    grasshopper_append128(target, &subkeys->k[0]);
}